

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevelFileReader.cpp
# Opt level: O1

string * __thiscall
LevelFileReader::GetWord_abi_cxx11_(string *__return_storage_ptr__,LevelFileReader *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_1f9d + 0x12);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)this->fileStream,(string *)__return_storage_ptr__,'\n');
  return __return_storage_ptr__;
}

Assistant:

std::string LevelFileReader::GetWord()
{
  std::string word = "";
  getline(fileStream, word, '\n');
  return word;
}